

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void put4bitcmaptile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                    int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  uint32_t **ppuVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  
  if (h != 0) {
    ppuVar2 = img->PALmap;
    do {
      uVar4 = w;
      if (1 < w) {
        do {
          bVar1 = *pp;
          pp = pp + 1;
          puVar3 = ppuVar2[bVar1];
          *cp = *puVar3;
          cp[1] = puVar3[1];
          cp = cp + 2;
          uVar4 = uVar4 - 2;
        } while (1 < uVar4);
      }
      if (uVar4 != 0) {
        bVar1 = *pp;
        pp = pp + 1;
        *cp = *ppuVar2[bVar1];
        cp = cp + 1;
      }
      pp = pp + fromskew / 2;
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put4bitcmaptile)
{
    uint32_t **PALmap = img->PALmap;

    (void)x;
    (void)y;
    fromskew /= 2;
    for (; h > 0; --h)
    {
        uint32_t *bw;
        UNROLL2(w, bw = PALmap[*pp++], *cp++ = *bw++);
        cp += toskew;
        pp += fromskew;
    }
}